

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecFindBestVar2(Sfm_Dec_t *p,word (*Masks) [8])

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int d;
  int Counts [2] [2];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  if (p->nDivs < 1) {
    iVar3 = -1;
  }
  else {
    iVar3 = -1;
    iVar4 = 1000000000;
    d = 0;
    do {
      Sfm_DecVarCost(p,Masks,d,(int (*) [2])&local_48);
      if (local_3c <= local_40 == local_48 < local_44) {
        iVar1 = local_44;
        if (local_48 < local_44) {
          iVar1 = local_48;
        }
        iVar2 = local_3c;
        if (local_40 < local_3c) {
          iVar2 = local_40;
        }
        iVar2 = iVar2 + iVar1;
        if (iVar2 < iVar4) {
          iVar3 = d;
        }
        if (iVar2 <= iVar4) {
          iVar4 = iVar2;
        }
      }
      d = d + 1;
    } while (d < p->nDivs);
  }
  return iVar3;
}

Assistant:

int Sfm_DecFindBestVar2( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int Counts[2][2];
    int d, VarBest = -1, CostBest = ABC_INFINITY, Cost;
    for ( d = 0; d < p->nDivs; d++ )
    {
        Sfm_DecVarCost( p, Masks, d, Counts );
        if ( (Counts[0][0] < Counts[0][1]) == (Counts[1][0] < Counts[1][1]) )
            continue;
        Cost = Abc_MinInt(Counts[0][0], Counts[0][1]) + Abc_MinInt(Counts[1][0], Counts[1][1]);
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            VarBest = d;
        }
    }
    return VarBest;
}